

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_finalize(sqlite3_stmt *pStmt)

{
  sqlite3 *db;
  int rc;
  int iVar1;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar1 = 0;
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db == (sqlite3 *)0x0) {
      iVar1 = 0x15;
      sqlite3_log(0x15,"API called with finalized prepared statement");
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1628f,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (0 < *(long *)(pStmt + 0xb8)) {
        invokeProfileCallback(db,(Vdbe *)pStmt);
      }
      rc = sqlite3VdbeReset((Vdbe *)pStmt);
      sqlite3VdbeDelete((Vdbe *)pStmt);
      if ((rc != 0) || (iVar1 = 0, db->mallocFailed != '\0')) {
        iVar1 = apiHandleError(db,rc);
      }
      sqlite3LeaveMutexAndCloseZombie(db);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_finalize(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    /* IMPLEMENTATION-OF: R-57228-12904 Invoking sqlite3_finalize() on a NULL
    ** pointer is a harmless no-op. */
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    if( vdbeSafety(v) ) return SQLITE_MISUSE_BKPT;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    assert( v->eVdbeState>=VDBE_READY_STATE );
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeDelete(v);
    rc = sqlite3ApiExit(db, rc);
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return rc;
}